

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *coScaleval,bool rowRatio)

{
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  uint uVar3;
  long lVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real a;
  undefined8 uVar5;
  fpclass_type fVar6;
  undefined8 uVar7;
  int iVar8;
  double *pdVar9;
  soplex *psVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  long *plVar14;
  bool bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  double local_1a8;
  soplex *local_1a0;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_158;
  ulong local_118;
  long local_110;
  long local_108;
  ulong local_100;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f8;
  long *local_f0;
  uint local_e8 [2];
  uint auStack_e0 [2];
  uint local_d8 [2];
  undefined8 uStack_d0;
  undefined8 local_c8;
  cpp_dec_float<50U,_int,_void> local_b8;
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [4];
  fpclass_type local_48;
  int32_t iStack_44;
  undefined8 uStack_40;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  local_1f0 = &__return_storage_ptr__->m_backend;
  local_f8 = lp;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  psVar10 = this + 0x100;
  if ((int)coScaleval != 0) {
    psVar10 = this + 0x38;
  }
  uVar3 = *(uint *)psVar10;
  if (0 < (int)uVar3) {
    local_1a0 = this;
    pdVar9 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_1a8 = *pdVar9;
    bVar15 = (char)coScaleval != '\0';
    local_108 = 0xe8;
    if (bVar15) {
      local_108 = 0x20;
    }
    local_110 = 0xf0;
    if (bVar15) {
      local_110 = 0x28;
    }
    local_100 = 0;
    local_118 = (ulong)uVar3;
    do {
      plVar14 = (long *)((long)*(int *)(*(long *)(local_1a0 + local_110) + 4 + local_100 * 8) * 0x28
                        + *(long *)(local_1a0 + local_108));
      ::soplex::infinity::__tls_init();
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems._32_5_ = 0;
      local_198.data._M_elems[9]._1_3_ = 0;
      local_198.exp = 0;
      local_198.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_198,local_1a8);
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems._32_5_ = 0;
      local_158.data._M_elems[9]._1_3_ = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_158,0.0);
      if (0 < *(int *)((long)plVar14 + 0xc)) {
        lVar12 = 0;
        lVar11 = 0;
        local_f0 = plVar14;
        do {
          lVar4 = *plVar14;
          local_c8 = *(undefined8 *)(lVar4 + 0x20 + lVar12);
          pauVar1 = (undefined1 (*) [16])(lVar4 + lVar12);
          local_e8 = *(uint (*) [2])*pauVar1;
          auStack_e0 = *(uint (*) [2])(*pauVar1 + 8);
          puVar2 = (uint *)(lVar4 + 0x10 + lVar12);
          local_d8 = *(uint (*) [2])puVar2;
          uStack_d0 = *(undefined8 *)(puVar2 + 2);
          local_228.exp = *(int *)(lVar4 + 0x28 + lVar12);
          local_228.neg = *(bool *)(lVar4 + 0x2c + lVar12);
          local_228.fpclass = *(fpclass_type *)(lVar4 + 0x30 + lVar12);
          local_228.prec_elem = *(int32_t *)(lVar4 + 0x34 + lVar12);
          local_228.data._M_elems._32_5_ = SUB85(local_c8,0);
          local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_c8 >> 0x28);
          local_228.data._M_elems[4] = local_d8[0];
          local_228.data._M_elems[5] = local_d8[1];
          local_228.data._M_elems[6] = (uint)uStack_d0;
          local_228.data._M_elems[7] = (uint)((ulong)uStack_d0 >> 0x20);
          if ((local_228.neg == true) &&
             (local_228.data._M_elems[0] = local_e8[0],
             local_228.data._M_elems[0] != 0 || local_228.fpclass != cpp_dec_float_finite)) {
            local_228.neg = false;
          }
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)
                    ((local_f8->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._vptr_ClassArray + (ulong)*(uint *)(*plVar14 + 0x38 + lVar12) * 7);
          local_1e8.fpclass = cpp_dec_float_finite;
          local_1e8.prec_elem = 10;
          local_1e8.data._M_elems[0] = 0;
          local_1e8.data._M_elems[1] = 0;
          local_1e8.data._M_elems[2] = 0;
          local_1e8.data._M_elems[3] = 0;
          local_1e8.data._M_elems[4] = 0;
          local_1e8.data._M_elems[5] = 0;
          local_1e8.data._M_elems[6] = 0;
          local_1e8.data._M_elems[7] = 0;
          local_1e8.data._M_elems._32_5_ = 0;
          local_1e8.data._M_elems[9]._1_3_ = 0;
          local_1e8.exp = 0;
          local_1e8.neg = false;
          v = &local_228;
          if (&local_1e8 != pcVar13) {
            local_1e8.neg = local_228.neg;
            local_1e8.prec_elem = local_228.prec_elem;
            local_1e8.fpclass = local_228.fpclass;
            v = pcVar13;
            local_1e8.data._M_elems._0_8_ = local_e8;
            local_1e8.data._M_elems._8_8_ = auStack_e0;
            local_1e8.data._M_elems._16_8_ = local_d8;
            local_1e8.data._M_elems[6] = local_228.data._M_elems[6];
            local_1e8.data._M_elems[7] = local_228.data._M_elems[7];
            local_1e8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
            local_1e8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
            local_1e8.exp = local_228.exp;
          }
          local_228.data._M_elems._0_16_ = *pauVar1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1e8,v);
          bVar15 = local_1e8.neg;
          iVar8 = local_1e8.exp;
          local_58[1]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
          local_58._0_5_ = local_1e8.data._M_elems._32_5_;
          auStack_60[1] = local_1e8.data._M_elems[7];
          auStack_60[0] = local_1e8.data._M_elems[6];
          local_68[0] = local_1e8.data._M_elems[4];
          local_68[1] = local_1e8.data._M_elems[5];
          local_78[0] = local_1e8.data._M_elems[0];
          local_78[1] = local_1e8.data._M_elems[1];
          auStack_70[0] = local_1e8.data._M_elems[2];
          auStack_70[1] = local_1e8.data._M_elems[3];
          local_48 = local_1e8.fpclass;
          iStack_44 = local_1e8.prec_elem;
          uStack_40 = 0;
          this_00 = *(Tolerances **)(local_1a0 + 0x1e0);
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_1a0 + 0x1e8);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a = Tolerances::epsilon(this_00);
          local_b8.data._M_elems[8] = local_58[0];
          local_b8.data._M_elems[9] = local_58[1];
          local_b8.data._M_elems[4] = local_68[0];
          local_b8.data._M_elems[5] = local_68[1];
          local_b8.data._M_elems[6] = auStack_60[0];
          local_b8.data._M_elems[7] = auStack_60[1];
          local_b8.data._M_elems[0] = local_78[0];
          local_b8.data._M_elems[1] = local_78[1];
          uVar7 = local_b8.data._M_elems._0_8_;
          local_b8.data._M_elems[2] = auStack_70[0];
          local_b8.data._M_elems[3] = auStack_70[1];
          local_b8.exp = iVar8;
          local_b8.neg = bVar15;
          fVar6 = local_48;
          uVar5._0_4_ = local_48;
          uVar5._4_4_ = iStack_44;
          local_b8.fpclass = local_48;
          local_b8.prec_elem = iStack_44;
          if ((bVar15 != false) &&
             (local_b8.data._M_elems[0] = local_78[0],
             local_b8.data._M_elems[0] != 0 || fVar6 != cpp_dec_float_finite)) {
            local_b8.neg = (bool)(bVar15 ^ 1);
          }
          bVar15 = false;
          local_b8.data._M_elems._0_8_ = uVar7;
          uVar7 = uVar5;
          if ((fVar6 != cpp_dec_float_NaN) && (uVar7 = local_b8._48_8_, !NAN(a))) {
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems[6] = 0;
            local_228.data._M_elems[7] = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            local_b8._48_8_ = uVar5;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,a);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_b8,&local_228);
            bVar15 = iVar8 < 1;
            uVar7 = local_b8._48_8_;
          }
          local_b8._48_8_ = uVar7;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          plVar14 = local_f0;
          if (!bVar15) {
            if (((local_1e8.fpclass != cpp_dec_float_NaN) &&
                (local_198.fpclass != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1e8,&local_198), iVar8 < 0)) {
              local_198.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_198.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_198.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_198.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_198.data._M_elems[6] = local_1e8.data._M_elems[6];
              local_198.data._M_elems[7] = local_1e8.data._M_elems[7];
              local_198.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_198.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_198.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_198.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_198.exp = local_1e8.exp;
              local_198.neg = local_1e8.neg;
              local_198.fpclass = local_1e8.fpclass;
              local_198.prec_elem = local_1e8.prec_elem;
            }
            if (((local_1e8.fpclass != cpp_dec_float_NaN) &&
                (local_158.fpclass != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1e8,&local_158), 0 < iVar8)) {
              local_158.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_158.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_158.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_158.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_158.data._M_elems[6] = local_1e8.data._M_elems[6];
              local_158.data._M_elems[7] = local_1e8.data._M_elems[7];
              local_158.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_158.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_158.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_158.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_158.exp = local_1e8.exp;
              local_158.neg = local_1e8.neg;
              local_158.fpclass = local_1e8.fpclass;
              local_158.prec_elem = local_1e8.prec_elem;
            }
          }
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + 0x3c;
        } while (lVar11 < *(int *)((long)plVar14 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 10;
      local_228.data._M_elems._0_16_ = ZEXT816(0);
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems[6] = 0;
      local_228.data._M_elems[7] = 0;
      local_228.data._M_elems._32_5_ = 0;
      local_228.data._M_elems[9]._1_3_ = 0;
      local_228.exp = 0;
      local_228.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_228,local_1a8);
      if (((local_198.fpclass == cpp_dec_float_NaN) || (local_228.fpclass == cpp_dec_float_NaN)) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_198,&local_228), iVar8 != 0)) {
        local_228.fpclass = cpp_dec_float_finite;
        local_228.prec_elem = 10;
        local_228.data._M_elems._0_16_ = ZEXT816(0);
        local_228.data._M_elems[4] = 0;
        local_228.data._M_elems[5] = 0;
        local_228.data._M_elems[6] = 0;
        local_228.data._M_elems[7] = 0;
        local_228.data._M_elems._32_5_ = 0;
        local_228.data._M_elems[9]._1_3_ = 0;
        local_228.exp = 0;
        local_228.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_228,&local_158,&local_198);
        if (((local_228.fpclass != cpp_dec_float_NaN) && (local_1f0->fpclass != cpp_dec_float_NaN))
           && (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_228,local_1f0), 0 < iVar8)) {
          *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems + 8) =
               CONCAT35(local_228.data._M_elems[9]._1_3_,local_228.data._M_elems._32_5_);
          (((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems[4] =
               local_228.data._M_elems[4];
          (((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems[5] =
               local_228.data._M_elems[5];
          (((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems[6] =
               local_228.data._M_elems[6];
          (((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems[7] =
               local_228.data._M_elems[7];
          *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems =
               local_228.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_1f0->data)->data)._M_elems + 2)
               = local_228.data._M_elems._8_8_;
          local_1f0->exp = local_228.exp;
          local_1f0->neg = local_228.neg;
          local_1f0->fpclass = local_228.fpclass;
          local_1f0->prec_elem = local_228.prec_elem;
        }
      }
      local_100 = local_100 + 1;
    } while (local_100 != local_118);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_1f0;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}